

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O3

int Abc_NtkDontCareQuantify(Odc_Man_t *p)

{
  ushort uVar1;
  Odc_Lit_t OVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  uVar1 = p->iRoot;
  if (uVar1 == 0xffff) {
    __assert_fail("p->iRoot < 0xffff",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcOdc.c"
                  ,0x312,"int Abc_NtkDontCareQuantify(Odc_Man_t *)");
  }
  iVar4 = p->vBranches->nSize;
  if (0x20 < iVar4) {
    __assert_fail("Vec_PtrSize(p->vBranches) <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcOdc.c"
                  ,0x313,"int Abc_NtkDontCareQuantify(Odc_Man_t *)");
  }
  if (iVar4 < 1) {
    iVar4 = p->nObjs;
  }
  else {
    iVar5 = 0;
    do {
      p->nTravIds = p->nTravIds + 1;
      uVar3 = Abc_NtkDontCareCofactors_rec(p,uVar1 & 0xfffe,1 << ((byte)iVar5 & 0x1f));
      uVar1 = p->iRoot & 1;
      OVar2 = Odc_And(p,uVar1 ^ (ushort)uVar3 ^ 1,uVar1 ^ (ushort)(uVar3 >> 0x10) ^ 1);
      uVar1 = OVar2 ^ 1;
      p->iRoot = uVar1;
      iVar4 = p->nObjs;
      if (0x4000 < iVar4) {
        return 0;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < p->vBranches->nSize);
  }
  if (iVar4 <= p->nObjsAlloc) {
    return 1;
  }
  __assert_fail("p->nObjs <= p->nObjsAlloc",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcOdc.c"
                ,0x321,"int Abc_NtkDontCareQuantify(Odc_Man_t *)");
}

Assistant:

int Abc_NtkDontCareQuantify( Odc_Man_t * p )
{   
    Odc_Lit_t uRes0, uRes1;
    unsigned uData;
    int i;
    assert( p->iRoot < 0xffff );
    assert( Vec_PtrSize(p->vBranches) <= 32 ); // the mask size
    for ( i = 0; i < Vec_PtrSize(p->vBranches); i++ )
    {
        // compute the cofactors w.r.t. this variable
        Odc_ManIncrementTravId( p );
        uData = Abc_NtkDontCareCofactors_rec( p, Odc_Regular(p->iRoot), (1 << i) );
        uRes0 = Odc_NotCond( (Odc_Lit_t)(uData & 0xffff), Odc_IsComplement(p->iRoot) );
        uRes1 = Odc_NotCond( (Odc_Lit_t)(uData >> 16),    Odc_IsComplement(p->iRoot) );
        // quantify this variable existentially
        p->iRoot = Odc_Or( p, uRes0, uRes1 );
        // check the limit
        if ( Odc_ObjNum(p) > ABC_DC_MAX_NODES/2 )
            return 0;
    }
    assert( p->nObjs <= p->nObjsAlloc );
    return 1;
}